

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

CaseProd *
slang::ast::RandSeqProductionSymbol::createCaseProd(RsCaseSyntax *syntax,ASTContext *context)

{
  SyntaxNode *this;
  size_type sVar1;
  Expression *args;
  span<const_slang::syntax::ExpressionSyntax_*const,_18446744073709551615UL> expressions_00;
  bool bVar2;
  int iVar3;
  StandardRsCaseItemSyntax *pSVar4;
  RsProdItemSyntax *pRVar5;
  DefaultRsCaseItemSyntax *pDVar6;
  ExpressionSyntax *pEVar7;
  Compilation *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  CaseProd *pCVar8;
  logic_error *this_01;
  pointer ppRVar9;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *pEVar10;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  size_t i;
  ulong uVar11;
  pointer ppRVar12;
  pointer pPVar13;
  Expression **args_00;
  SmallVectorBase<const_slang::ast::Expression_*> *in_stack_fffffffffffffb88;
  SmallVector<const_slang::ast::Expression_*,_5UL> bound;
  undefined1 local_408 [32];
  pointer local_3e8;
  size_type sStack_3e0;
  SmallVector<const_slang::ast::Expression_*,_5UL> group;
  optional<slang::ast::RandSeqProductionSymbol::ProdItem> defItem;
  string local_360;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  SmallVector<const_slang::syntax::ExpressionSyntax_*,_5UL> expressions;
  SmallVector<slang::ast::RandSeqProductionSymbol::CaseItem,_8UL> items;
  SmallVector<slang::ast::RandSeqProductionSymbol::ProdItem,_8UL> prods;
  
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_ =
       (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.
                firstElement;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len = 0;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.data_ =
       (pointer)prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.
                firstElement;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.len = 0;
  expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.cap = 5;
  prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.cap = 8;
  defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>._M_payload
  .super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>._M_engaged = false;
  ppRVar9 = (syntax->items).super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.
            data_;
  ppRVar12 = ppRVar9 + (syntax->items).
                       super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.size_;
  bVar2 = false;
  do {
    if (ppRVar9 == ppRVar12) {
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)bound.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
      pEVar7 = not_null<slang::syntax::ExpressionSyntax_*>::get(&syntax->expr);
      expressions_00.size_ = (size_type)&bound;
      expressions_00.data_ =
           (pointer)expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.len;
      Expression::bindMembershipExpressions
                ((Expression *)context,(ASTContext *)0x74,Unknown,false,true,true,SUB81(pEVar7,0),
                 (ExpressionSyntax *)
                 expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>.data_,
                 expressions_00,in_stack_fffffffffffffb88);
      items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.data_ =
           (pointer)items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.
                    firstElement;
      items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.len = 0;
      items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.cap = 8;
      group.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)group.super_SmallVectorBase<const_slang::ast::Expression_*>.firstElement;
      group.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      group.super_SmallVectorBase<const_slang::ast::Expression_*>.cap = 5;
      this_00 = ASTContext::getCompilation(context);
      args = *bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_;
      args_00 = bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ + 1;
      ppRVar12 = (syntax->items).
                 super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.data_;
      ppRVar9 = ppRVar12 +
                (syntax->items).
                super_span<slang::syntax::RsCaseItemSyntax_*,_18446744073709551615UL>.size_;
      pEVar10 = extraout_RDX;
      pPVar13 = prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>.data_;
      for (; ppRVar12 != ppRVar9; ppRVar12 = ppRVar12 + 1) {
        if (((*ppRVar12)->super_SyntaxNode).kind == StandardRsCaseItem) {
          pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>
                             (&(*ppRVar12)->super_SyntaxNode);
          pEVar10 = extraout_RDX_00;
          for (uVar11 = 0; uVar11 < (pSVar4->expressions).elements.size_ + 1 >> 1;
              uVar11 = uVar11 + 1) {
            SmallVectorBase<slang::ast::Expression_const*>::
            emplace_back<slang::ast::Expression_const*const&>
                      ((SmallVectorBase<slang::ast::Expression_const*> *)&group,args_00);
            args_00 = args_00 + 1;
            pEVar10 = extraout_RDX_01;
          }
          iVar3 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                            (&group.super_SmallVectorBase<const_slang::ast::Expression_*>,
                             (EVP_PKEY_CTX *)this_00,pEVar10);
          local_408._0_8_ = CONCAT44(extraout_var,iVar3);
          local_408._16_8_ = *(undefined8 *)pPVar13;
          local_408._24_8_ = pPVar13->target;
          local_3e8 = (pPVar13->args).data_;
          sStack_3e0 = (pPVar13->args).size_;
          SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::
          emplace_back<slang::ast::RandSeqProductionSymbol::CaseItem>
                    (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>,
                     (CaseItem *)local_408);
          pPVar13 = pPVar13 + 1;
          group.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
          pEVar10 = extraout_RDX_02;
        }
      }
      iVar3 = SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::copy
                        (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>
                         ,(EVP_PKEY_CTX *)this_00,pEVar10);
      local_408._0_8_ = CONCAT44(extraout_var_00,iVar3);
      pCVar8 = BumpAllocator::
               emplace<slang::ast::RandSeqProductionSymbol::CaseProd,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::RandSeqProductionSymbol::CaseItem,18446744073709551615ul>,std::optional<slang::ast::RandSeqProductionSymbol::ProdItem>&>
                         (&this_00->super_BumpAllocator,args,
                          (span<slang::ast::RandSeqProductionSymbol::CaseItem,_18446744073709551615UL>
                           *)local_408,&defItem);
      SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                (&group.super_SmallVectorBase<const_slang::ast::Expression_*>);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>::~SmallVectorBase
                (&items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>);
      SmallVectorBase<const_slang::ast::Expression_*>::~SmallVectorBase
                (&bound.super_SmallVectorBase<const_slang::ast::Expression_*>);
      SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::~SmallVectorBase
                (&prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>);
      SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>::~SmallVectorBase
                (&expressions.super_SmallVectorBase<const_slang::syntax::ExpressionSyntax_*>);
      return pCVar8;
    }
    this = &(*ppRVar9)->super_SyntaxNode;
    if (this->kind == DefaultRsCaseItem) {
      if (!bVar2) {
        pDVar6 = slang::syntax::SyntaxNode::as<slang::syntax::DefaultRsCaseItemSyntax>(this);
        pRVar5 = not_null<slang::syntax::RsProdItemSyntax_*>::get(&pDVar6->item);
        createProdItem((ProdItem *)&items,pRVar5,context);
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._M_value.args.data_ =
             (pointer)items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.cap
        ;
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._24_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [0];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._25_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [1];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._26_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [2];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._27_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [3];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._28_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [4];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._29_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [5];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._30_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [6];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._31_1_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.firstElement
             [7];
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._0_8_ =
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.data_;
        defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
        _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
        _M_payload._M_value.target =
             (RandSeqProductionSymbol *)
             items.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::CaseItem>.len;
        if (!bVar2) {
          defItem.super__Optional_base<slang::ast::RandSeqProductionSymbol::ProdItem,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::RandSeqProductionSymbol::ProdItem>.
          _M_engaged = true;
          bVar2 = true;
        }
      }
    }
    else {
      if (this->kind != StandardRsCaseItem) {
        this_01 = (logic_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                   ,(allocator<char> *)&stack0xfffffffffffffb8f);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,&local_340,":");
        std::__cxx11::to_string(&local_360,0x589);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&group,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_408,&local_360);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bound,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&group,
                       ": ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&items,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&bound,
                       "Default case should be unreachable!");
        std::logic_error::logic_error(this_01,(string *)&items);
        __cxa_throw(this_01,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      pSVar4 = slang::syntax::SyntaxNode::as<slang::syntax::StandardRsCaseItemSyntax>(this);
      pRVar5 = not_null<slang::syntax::RsProdItemSyntax_*>::get(&pSVar4->item);
      createProdItem((ProdItem *)&items,pRVar5,context);
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len = 0;
      sVar1 = (pSVar4->expressions).elements.size_;
      bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
           (pointer)&pSVar4->expressions;
      for (; ((SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)
              bound.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ !=
              &pSVar4->expressions ||
             (bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len != sVar1 + 1 >> 1));
          bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len =
               bound.super_SmallVectorBase<const_slang::ast::Expression_*>.len + 1) {
        group.super_SmallVectorBase<const_slang::ast::Expression_*>.data_ =
             (pointer)slang::syntax::SeparatedSyntaxList<slang::syntax::ExpressionSyntax>::
                      iterator_base<slang::syntax::ExpressionSyntax_*>::operator*
                                ((iterator_base<slang::syntax::ExpressionSyntax_*> *)&bound);
        SmallVectorBase<slang::syntax::ExpressionSyntax_const*>::
        emplace_back<slang::syntax::ExpressionSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ExpressionSyntax_const*> *)&expressions,
                   (ExpressionSyntax **)&group);
        SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>::
        emplace_back<slang::ast::RandSeqProductionSymbol::ProdItem_const&>
                  (&prods.super_SmallVectorBase<slang::ast::RandSeqProductionSymbol::ProdItem>,
                   (ProdItem *)&items);
      }
    }
    ppRVar9 = ppRVar9 + 1;
  } while( true );
}

Assistant:

const RandSeqProductionSymbol::CaseProd& RandSeqProductionSymbol::createCaseProd(
    const RsCaseSyntax& syntax, const ASTContext& context) {

    SmallVector<const ExpressionSyntax*> expressions;
    SmallVector<ProdItem, 8> prods;
    std::optional<ProdItem> defItem;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                auto pi = createProdItem(*sci.item, context);
                for (auto es : sci.expressions) {
                    expressions.push_back(es);
                    prods.push_back(pi);
                }
                break;
            }
            case SyntaxKind::DefaultRsCaseItem:
                // The parser already errored for duplicate defaults,
                // so just ignore if it happens here.
                if (!defItem)
                    defItem = createProdItem(*item->as<DefaultRsCaseItemSyntax>().item, context);
                break;
            default:
                ASSUME_UNREACHABLE;
        }
    }

    SmallVector<const Expression*> bound;
    Expression::bindMembershipExpressions(context, TokenKind::CaseKeyword,
                                          /* requireIntegral */ false,
                                          /* unwrapUnpacked */ false,
                                          /* allowTypeReferences */ true, /* allowOpenRange */ true,
                                          *syntax.expr, expressions, bound);

    SmallVector<CaseItem, 8> items;
    SmallVector<const Expression*> group;
    auto& comp = context.getCompilation();
    auto boundIt = bound.begin();
    auto prodIt = prods.begin();
    auto expr = *boundIt++;

    for (auto item : syntax.items) {
        switch (item->kind) {
            case SyntaxKind::StandardRsCaseItem: {
                auto& sci = item->as<StandardRsCaseItemSyntax>();
                for (size_t i = 0; i < sci.expressions.size(); i++)
                    group.push_back(*boundIt++);

                items.push_back({group.copy(comp), *prodIt++});
                group.clear();
                break;
            }
            default:
                break;
        }
    }

    return *comp.emplace<CaseProd>(*expr, items.copy(comp), defItem);
}